

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cc
# Opt level: O0

bool __thiscall
my_crc_basic::calc_crc
          (my_crc_basic *this,value_type use_initial,
          dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *msg,value_type expected_crc
          ,FEED_TYPE feed_type)

{
  bool bVar1;
  value_type vVar2;
  size_type sVar3;
  my_crc_basic *pmVar4;
  value_type in_ECX;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  value_type in_ESI;
  my_crc_basic *in_RDI;
  int in_R8D;
  int j;
  size_t i_2;
  int i_1;
  size_t i;
  size_type in_stack_ffffffffffffffa8;
  ulong pos;
  my_crc_basic *in_stack_ffffffffffffffb0;
  int local_3c;
  ulong local_38;
  int local_2c;
  my_crc_basic *local_28;
  int local_20;
  
  reset(in_RDI,in_ESI);
  local_20 = in_R8D;
  if (in_R8D == 0) {
    if ((in_RDI->rft_in_ & 1U) == 0) {
      local_20 = 1;
    }
    else {
      sVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDX);
      if ((sVar3 & 7) == 0) {
        local_20 = 3;
      }
      else {
        local_20 = 2;
      }
    }
  }
  if (local_20 == 1) {
    local_28 = (my_crc_basic *)0x0;
    while (in_stack_ffffffffffffffb0 = local_28,
          pmVar4 = (my_crc_basic *)
                   boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::size
                             (in_RDX), in_stack_ffffffffffffffb0 < pmVar4) {
      bVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      process_bit(in_RDI,bVar1);
      local_28 = (my_crc_basic *)
                 ((long)&(((buffer_type *)&local_28->width_)->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start + 1);
    }
  }
  else if (local_20 == 2) {
    sVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDX);
    local_2c = (int)sVar3;
    while (local_2c = local_2c + -1, -1 < local_2c) {
      bVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      process_bit(in_RDI,bVar1);
    }
  }
  else if (local_20 == 3) {
    local_38 = 0;
    while (pos = local_38,
          sVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDX)
          , pos < sVar3) {
      for (local_3c = 1; local_3c < 9; local_3c = local_3c + 1) {
        bVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_ffffffffffffffb0,pos);
        process_bit(in_RDI,bVar1);
      }
      local_38 = local_38 + 8;
    }
  }
  vVar2 = checksum(in_stack_ffffffffffffffb0);
  return vVar2 == in_ECX;
}

Assistant:

bool my_crc_basic::calc_crc(value_type const use_initial,
			    boost::dynamic_bitset<> const& msg,
			    value_type const expected_crc,
			    FEED_TYPE feed_type) {
  
  reset(use_initial);	


  if(feed_type == AUTO) {
    if(rft_in_) {
      if (msg.size() % 8 != 0) feed_type = LINEAR_REVERSED;
      else feed_type = BYTEWISE_REVERSED;
    }
    else {
      feed_type = LINEAR_FORWARD;
    }
  }


  
  if(feed_type == LINEAR_FORWARD) {
    for (size_t i = 0; i < msg.size(); i++) {
      process_bit(msg[i]);
    }
  }
  else if(feed_type == LINEAR_REVERSED) {
    for (int i = msg.size()-1; i >= 0; i--) {
      process_bit(msg[i]);
    }
  }
  else if(feed_type == BYTEWISE_REVERSED) {

      for(size_t i = 0; i < msg.size(); i+=8) {
	// inverse feeding
	for(int j = 1; j <= 8; j++)
	  process_bit(msg[i + 8 - j]);
      }
  }
  
  return checksum() == expected_crc;
}